

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::hufEncode(longlong *hcode,unsigned_short *in,int ni,int rlc,char *out)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int local_38;
  
  uVar3 = *in;
  pcVar11 = out;
  if (ni < 2) {
    uVar13 = 0;
    iVar9 = 0;
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    uVar15 = 1;
    iVar9 = 0;
    uVar13 = 0;
    do {
      if (iVar5 < 0xff && uVar3 == in[uVar15]) {
        iVar10 = iVar5 + 1;
      }
      else {
        lVar1 = hcode[rlc];
        uVar7 = (uint)hcode[uVar3];
        uVar6 = uVar7 & 0x3f;
        uVar8 = (uint)lVar1;
        uVar4 = uVar8 & 0x3f;
        uVar12 = hcode[uVar3] >> 6;
        if ((long)((ulong)uVar4 + (ulong)uVar6 + 8) < (long)((ulong)uVar6 * (long)iVar5)) {
          uVar12 = uVar13 << (sbyte)uVar6 | uVar12;
          iVar9 = (uVar7 & 0x3f) + iVar9;
          iVar16 = iVar9;
          iVar10 = iVar9;
          if (7 < iVar9) {
            do {
              *pcVar11 = (char)((long)uVar12 >> ((byte)(iVar16 + -8) & 0x3f));
              pcVar11 = pcVar11 + 1;
              iVar10 = iVar9 + -8;
              bVar2 = 0xf < iVar9;
              iVar9 = iVar10;
              iVar16 = iVar16 + -8;
            } while (bVar2);
          }
          iVar10 = (uVar8 & 0x3f) + iVar10;
          uVar13 = uVar12 << (sbyte)uVar4 | lVar1 >> 6;
          iVar9 = iVar10;
          iVar16 = iVar10;
          if (7 < iVar10) {
            do {
              *pcVar11 = (char)((long)uVar13 >> ((byte)(iVar9 + -8) & 0x3f));
              pcVar11 = pcVar11 + 1;
              iVar16 = iVar10 + -8;
              bVar2 = 0xf < iVar10;
              iVar10 = iVar16;
              iVar9 = iVar9 + -8;
            } while (bVar2);
          }
          iVar9 = iVar16 + 8;
          uVar13 = uVar13 << 8 | (long)iVar5;
          iVar10 = 0;
          if (-1 < iVar16) {
            iVar5 = iVar16 + 0x10;
            do {
              iVar16 = iVar5;
              iVar9 = iVar9 + -8;
              *pcVar11 = (char)((long)uVar13 >> ((byte)iVar9 & 0x3f));
              pcVar11 = pcVar11 + 1;
              iVar5 = iVar16 + -8;
            } while (0xf < iVar5);
            iVar9 = iVar16 + -0x10;
          }
        }
        else {
          iVar10 = 0;
          if (-1 < iVar5) {
            do {
              iVar9 = iVar9 + (uVar7 & 0x3f);
              uVar13 = uVar13 << (sbyte)uVar6 | uVar12;
              iVar14 = iVar9;
              iVar16 = iVar9;
              if (7 < iVar9) {
                do {
                  *pcVar11 = (char)((long)uVar13 >> ((byte)(iVar16 + -8) & 0x3f));
                  pcVar11 = pcVar11 + 1;
                  iVar9 = iVar14 + -8;
                  bVar2 = 0xf < iVar14;
                  iVar14 = iVar9;
                  iVar16 = iVar16 + -8;
                } while (bVar2);
              }
              bVar2 = 0 < iVar5;
              iVar5 = iVar5 + -1;
            } while (bVar2);
          }
        }
      }
      iVar5 = iVar10;
      uVar3 = in[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)ni);
  }
  lVar1 = hcode[rlc];
  uVar7 = (uint)hcode[uVar3];
  uVar4 = uVar7 & 0x3f;
  uVar8 = (uint)lVar1;
  uVar6 = uVar8 & 0x3f;
  uVar15 = hcode[uVar3] >> 6;
  if ((long)((ulong)uVar4 + (ulong)uVar6 + 8) < (long)((ulong)uVar4 * (long)iVar5)) {
    uVar15 = uVar13 << (sbyte)uVar4 | uVar15;
    iVar9 = (uVar7 & 0x3f) + iVar9;
    iVar16 = iVar9;
    iVar10 = iVar9;
    if (7 < iVar9) {
      do {
        *pcVar11 = (char)((long)uVar15 >> ((byte)(iVar16 + -8) & 0x3f));
        pcVar11 = pcVar11 + 1;
        iVar10 = iVar9 + -8;
        bVar2 = 0xf < iVar9;
        iVar9 = iVar10;
        iVar16 = iVar16 + -8;
      } while (bVar2);
    }
    iVar10 = (uVar8 & 0x3f) + iVar10;
    uVar13 = uVar15 << (sbyte)uVar6 | lVar1 >> 6;
    iVar9 = iVar10;
    iVar16 = iVar10;
    if (7 < iVar10) {
      do {
        *pcVar11 = (char)((long)uVar13 >> ((byte)(iVar9 + -8) & 0x3f));
        pcVar11 = pcVar11 + 1;
        iVar16 = iVar10 + -8;
        bVar2 = 0xf < iVar10;
        iVar10 = iVar16;
        iVar9 = iVar9 + -8;
      } while (bVar2);
    }
    iVar9 = iVar16 + 8;
    uVar13 = uVar13 << 8 | (long)iVar5;
    if (-1 < iVar16) {
      iVar5 = iVar16 + 0x10;
      do {
        iVar10 = iVar5;
        iVar9 = iVar9 + -8;
        *pcVar11 = (char)((long)uVar13 >> ((byte)iVar9 & 0x3f));
        pcVar11 = pcVar11 + 1;
        iVar5 = iVar10 + -8;
      } while (0xf < iVar5);
      iVar9 = iVar10 + -0x10;
    }
  }
  else if (-1 < iVar5) {
    do {
      iVar16 = iVar9 + (uVar7 & 0x3f);
      uVar13 = uVar13 << (sbyte)uVar4 | uVar15;
      iVar10 = iVar16;
      iVar9 = iVar16;
      if (7 < iVar16) {
        do {
          *pcVar11 = (char)((long)uVar13 >> ((byte)(iVar10 + -8) & 0x3f));
          pcVar11 = pcVar11 + 1;
          iVar9 = iVar16 + -8;
          bVar2 = 0xf < iVar16;
          iVar16 = iVar9;
          iVar10 = iVar10 + -8;
        } while (bVar2);
      }
      bVar2 = 0 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar2);
  }
  if (iVar9 != 0) {
    *pcVar11 = (char)(uVar13 << (8U - (char)iVar9 & 0x3f));
  }
  local_38 = (int)out;
  return iVar9 + ((int)pcVar11 - local_38) * 8;
}

Assistant:

int hufEncode                   // return: output size (in bits)
    (const long long *hcode,    // i : encoding table
     const unsigned short *in,  // i : uncompressed input buffer
     const int ni,              // i : input buffer size (in bytes)
     int rlc,                   // i : rl code
     char *out)                 //  o: compressed output buffer
{
  char *outStart = out;
  long long c = 0;  // bits not yet written to out
  int lc = 0;       // number of valid bits in c (LSB)
  int s = in[0];
  int cs = 0;

  //
  // Loop on input values
  //

  for (int i = 1; i < ni; i++) {
    //
    // Count same values or send code
    //

    if (s == in[i] && cs < 255) {
      cs++;
    } else {
      sendCode(hcode[s], cs, hcode[rlc], c, lc, out);
      cs = 0;
    }

    s = in[i];
  }

  //
  // Send remaining code
  //

  sendCode(hcode[s], cs, hcode[rlc], c, lc, out);

  if (lc) *out = (c << (8 - lc)) & 0xff;

  return (out - outStart) * 8 + lc;
}